

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_info_subject_alt_name(char **buf,size_t *size,mbedtls_x509_sequence *subject_alt_name)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  bool bVar8;
  
  uVar2 = *size;
  pcVar1 = *buf;
  if (subject_alt_name != (mbedtls_x509_sequence *)0x0) {
    bVar6 = false;
    lVar5 = 0;
    pcVar4 = anon_var_dwarf_d406 + 9;
    do {
      uVar3 = (subject_alt_name->buf).len + lVar5;
      bVar8 = uVar2 < uVar3;
      uVar2 = uVar2 - uVar3;
      if (bVar8 || uVar2 == 0) {
        *pcVar1 = '\0';
        return -0x2980;
      }
      if (bVar6) {
        lVar7 = 0;
        do {
          pcVar1[lVar7] = pcVar4[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
        pcVar1 = pcVar1 + lVar7;
      }
      if ((subject_alt_name->buf).len != 0) {
        uVar3 = 0;
        do {
          pcVar1[uVar3] = (subject_alt_name->buf).p[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar3 < (subject_alt_name->buf).len);
        pcVar1 = pcVar1 + uVar3;
      }
      subject_alt_name = subject_alt_name->next;
      lVar5 = 2;
      bVar6 = true;
      pcVar4 = ", ";
    } while (subject_alt_name != (mbedtls_asn1_sequence *)0x0);
  }
  *pcVar1 = '\0';
  *size = uVar2;
  *buf = pcVar1;
  return 0;
}

Assistant:

static int x509_info_subject_alt_name( char **buf, size_t *size,
                                       const mbedtls_x509_sequence *subject_alt_name )
{
    size_t i;
    size_t n = *size;
    char *p = *buf;
    const mbedtls_x509_sequence *cur = subject_alt_name;
    const char *sep = "";
    size_t sep_len = 0;

    while( cur != NULL )
    {
        if( cur->buf.len + sep_len >= n )
        {
            *p = '\0';
            return( MBEDTLS_ERR_X509_BUFFER_TOO_SMALL );
        }

        n -= cur->buf.len + sep_len;
        for( i = 0; i < sep_len; i++ )
            *p++ = sep[i];
        for( i = 0; i < cur->buf.len; i++ )
            *p++ = cur->buf.p[i];

        sep = ", ";
        sep_len = 2;

        cur = cur->next;
    }

    *p = '\0';

    *size = n;
    *buf = p;

    return( 0 );
}